

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_cv_posix.cpp
# Opt level: O0

ssize_t pstore::descriptor_condition_variable::write(int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  int *piVar2;
  uint *puVar3;
  undefined1 local_11;
  int local_10;
  uint uStack_c;
  pipe_content_type buffer;
  int fd_local;
  
  local_11 = 0;
  local_10 = __fd;
  do {
    sVar1 = ::write(local_10,&local_11,1);
    if (-1 < sVar1) {
      uStack_c = 0;
      goto LAB_0015d65d;
    }
    piVar2 = __errno_location();
  } while ((*piVar2 == 4) || (piVar2 = __errno_location(), *piVar2 == 0xb));
  puVar3 = (uint *)__errno_location();
  uStack_c = *puVar3;
LAB_0015d65d:
  return (ulong)uStack_c;
}

Assistant:

int descriptor_condition_variable::write (int const fd) noexcept {
        pipe_content_type const buffer{};
        for (;;) {
            if (::write (fd, &buffer, sizeof (buffer)) < 0) {
                if (errno != EINTR && errno != EAGAIN) {
                    return errno;
                }
                // Retry the write.
            } else {
                // Success.
                break;
            }
        }
        return 0;
    }